

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O1

mg_date_time_zone_id *
mg_date_time_zone_id_copy_ca(mg_date_time_zone_id *src,mg_allocator *allocator)

{
  int64_t iVar1;
  mg_date_time_zone_id *pmVar2;
  
  if ((src != (mg_date_time_zone_id *)0x0) &&
     (pmVar2 = (mg_date_time_zone_id *)mg_allocator_malloc(allocator,0x18),
     pmVar2 != (mg_date_time_zone_id *)0x0)) {
    pmVar2->tz_id = src->tz_id;
    iVar1 = src->nanoseconds;
    pmVar2->seconds = src->seconds;
    pmVar2->nanoseconds = iVar1;
    return pmVar2;
  }
  return (mg_date_time_zone_id *)0x0;
}

Assistant:

mg_date_time_zone_id *mg_date_time_zone_id_copy_ca(
    const mg_date_time_zone_id *src, mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_date_time_zone_id *date_time_zone_id =
      mg_date_time_zone_id_alloc(allocator);
  if (!date_time_zone_id) {
    return NULL;
  }
  memcpy(date_time_zone_id, src, sizeof(mg_date_time_zone_id));
  return date_time_zone_id;
}